

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall Js::GlobalObject::InitFuncScoped(GlobalObject *this,PropertyId propertyId,Var value)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  byte local_21;
  PropertyAttributes attributes;
  Var pvStack_20;
  bool noRedecl;
  Var value_local;
  GlobalObject *pGStack_10;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  local_21 = 0;
  pvStack_20 = value;
  value_local._4_4_ = propertyId;
  pGStack_10 = this;
  pDVar2 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  iVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x1f])
                    (pDVar2,this,(ulong)value_local._4_4_,&local_21,0);
  if ((iVar1 == 0) || ((local_21 & 1) == 0)) {
    DynamicObject::SetPropertyWithAttributes
              ((DynamicObject *)this,value_local._4_4_,pvStack_20,'\a',(PropertyValueInfo *)0x0,
               PropertyOperation_ThrowIfNotExtensible,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL GlobalObject::InitFuncScoped(PropertyId propertyId, Var value)
    {
        // Var binding of functions declared in eval are elided when conflicting
        // with global scope let/const variables, so do not actually set the
        // property if it exists and is a let/const variable.
        bool noRedecl = false;
        if (!GetTypeHandler()->HasRootProperty(this, propertyId, &noRedecl) || !noRedecl)
        {
            //
            // var x = 10; variables declared with "var" inside "eval"
            // These CAN be deleted
            // in ES5 they are enumerable.

            PropertyAttributes attributes = PropertyDynamicTypeDefaults;

            DynamicObject::SetPropertyWithAttributes(propertyId, value, attributes, NULL, PropertyOperation_ThrowIfNotExtensible);
        }
        return true;
    }